

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataStatePtr
xmlAutomataNewOnceTrans2
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,
          xmlChar *token2,int min,int max,void *data)

{
  int iVar1;
  int iVar2;
  xmlRegAtomPtr atom_00;
  xmlChar *pxVar3;
  size_t sVar4;
  void *__dest;
  xmlChar *str;
  int lenp;
  int lenn;
  int counter;
  xmlRegAtomPtr atom;
  int min_local;
  xmlChar *token2_local;
  xmlChar *token_local;
  xmlAutomataStatePtr to_local;
  xmlAutomataStatePtr from_local;
  xmlAutomataPtr am_local;
  
  if (((am == (xmlAutomataPtr)0x0) || (from == (xmlAutomataStatePtr)0x0)) ||
     (token == (xmlChar *)0x0)) {
    return (xmlAutomataStatePtr)0x0;
  }
  if (min < 1) {
    return (xmlAutomataStatePtr)0x0;
  }
  if (max < min) {
    return (xmlAutomataStatePtr)0x0;
  }
  atom_00 = xmlRegNewAtom(am,XML_REGEXP_STRING);
  if (atom_00 == (xmlRegAtomPtr)0x0) {
    return (xmlAutomataStatePtr)0x0;
  }
  if ((token2 == (xmlChar *)0x0) || (*token2 == '\0')) {
    pxVar3 = xmlStrdup(token);
    atom_00->valuep = pxVar3;
    if (atom_00->valuep == (void *)0x0) goto LAB_001b8c7d;
  }
  else {
    sVar4 = strlen((char *)token2);
    iVar2 = (int)sVar4;
    sVar4 = strlen((char *)token);
    iVar1 = (int)sVar4;
    __dest = (*xmlMalloc)((long)(iVar2 + iVar1 + 2));
    if (__dest == (void *)0x0) goto LAB_001b8c7d;
    memcpy(__dest,token,(long)iVar1);
    *(undefined1 *)((long)__dest + (long)iVar1) = 0x7c;
    memcpy((void *)((long)__dest + (long)(iVar1 + 1)),token2,(long)iVar2);
    *(undefined1 *)((long)__dest + (long)(iVar2 + iVar1 + 1)) = 0;
    atom_00->valuep = __dest;
  }
  atom_00->data = data;
  atom_00->quant = XML_REGEXP_QUANT_ONCEONLY;
  atom_00->min = min;
  atom_00->max = max;
  iVar2 = xmlRegGetCounter(am);
  if (-1 < iVar2) {
    am->counters[iVar2].min = 1;
    am->counters[iVar2].max = 1;
    token_local = (xmlChar *)to;
    if ((to != (xmlAutomataStatePtr)0x0) ||
       (token_local = (xmlChar *)xmlRegStatePush(am),
       (xmlRegStatePtr)token_local != (xmlRegStatePtr)0x0)) {
      xmlRegStateAddTrans(am,from,atom_00,(xmlRegStatePtr)token_local,iVar2,-1);
      iVar2 = xmlRegAtomPush(am,atom_00);
      if (-1 < iVar2) {
        am->state = (xmlRegStatePtr)token_local;
        return (xmlAutomataStatePtr)token_local;
      }
    }
  }
LAB_001b8c7d:
  xmlRegFreeAtom(atom_00);
  return (xmlAutomataStatePtr)0x0;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewOnceTrans2(xmlAutomataPtr am, xmlAutomataStatePtr from,
			 xmlAutomataStatePtr to, const xmlChar *token,
			 const xmlChar *token2,
			 int min, int max, void *data) {
    xmlRegAtomPtr atom;
    int counter;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    if (min < 1)
	return(NULL);
    if (max < min)
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    if ((token2 == NULL) || (*token2 == 0)) {
	atom->valuep = xmlStrdup(token);
        if (atom->valuep == NULL)
            goto error;
    } else {
	int lenn, lenp;
	xmlChar *str;

	lenn = strlen((char *) token2);
	lenp = strlen((char *) token);

	str = xmlMalloc(lenn + lenp + 2);
	if (str == NULL)
	    goto error;
	memcpy(&str[0], token, lenp);
	str[lenp] = '|';
	memcpy(&str[lenp + 1], token2, lenn);
	str[lenn + lenp + 1] = 0;

	atom->valuep = str;
    }
    atom->data = data;
    atom->quant = XML_REGEXP_QUANT_ONCEONLY;
    atom->min = min;
    atom->max = max;
    /*
     * associate a counter to the transition.
     */
    counter = xmlRegGetCounter(am);
    if (counter < 0)
        goto error;
    am->counters[counter].min = 1;
    am->counters[counter].max = 1;

    /* xmlFAGenerateTransitions(am, from, to, atom); */
    if (to == NULL) {
	to = xmlRegStatePush(am);
        if (to == NULL)
            goto error;
    }
    xmlRegStateAddTrans(am, from, atom, to, counter, -1);
    if (xmlRegAtomPush(am, atom) < 0)
        goto error;
    am->state = to;
    return(to);

error:
    xmlRegFreeAtom(atom);
    return(NULL);
}